

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O2

int drain_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  int converter_type;
  long *plVar1;
  FILE *__stream;
  SRC_STATE *state;
  char *pcVar2;
  code *pcVar3;
  ulong uVar4;
  int iStack_1c;
  
  if (field == 1) {
    if (*value == '\x01') {
      pcVar3 = mix_noop;
    }
    else {
      pcVar3 = drain_segment_mix;
    }
    segment->mix = pcVar3;
    return 1;
  }
  plVar1 = (long *)segment->data;
  if (field == 1) {
    if (*value == '\x01') {
      for (uVar4 = 0; uVar4 < *(byte *)(*plVar1 + 0x1c); uVar4 = uVar4 + 1) {
        mixed_buffer_clear((mixed_buffer *)plVar1[uVar4 + 1]);
      }
      pcVar3 = mix_noop;
    }
    else {
      pcVar3 = source_segment_mix;
    }
    segment->mix = pcVar3;
  }
  else {
    if (field != 3) {
      if (field == 4) {
        converter_type = *value;
        *(int *)((long)plVar1 + 0x7c) = converter_type;
        state = src_new(converter_type,(uint)*(byte *)(*plVar1 + 0x1c),&iStack_1c);
        __stream = _stderr;
        if (state == (SRC_STATE *)0x0) {
          pcVar2 = src_strerror(iStack_1c);
          fprintf(__stream,"libsamplerate: %s\n",pcVar2);
          mixed_err(1);
        }
        else {
          src_delete(state);
        }
        return (uint)(state != (SRC_STATE *)0x0);
      }
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)(plVar1 + 0xf) = *value;
  }
  return 1;
}

Assistant:

int drain_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  switch(field){
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = mix_noop;
    }else{
      segment->mix = drain_segment_mix;
    }
    return 1;
  default:
    return source_segment_set(field, value, segment);
  }
}